

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O1

void __thiscall QWizardPrivate::switchToPage(QWizardPrivate *this,int newId,Direction direction)

{
  qsizetype *pqVar1;
  QWidget *this_00;
  Data *pDVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  FocusPolicy FVar6;
  QWidget *pQVar7;
  QWidget *this_01;
  ulong uVar8;
  QWidget *this_02;
  long in_FS_OFFSET;
  int local_4c;
  QWizardPage *local_48;
  int *piStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  disableUpdates(this);
  local_4c = *(int *)(*(long *)&this_00->field_0x8 + 0x340);
  local_48 = (QWizardPage *)0x0;
  pQVar7 = &QMap<int,_QWizardPage_*>::value
                      ((QMap<int,_QWizardPage_*> *)(*(long *)&this_00->field_0x8 + 0x2e0),&local_4c,
                       &local_48)->super_QWidget;
  if ((pQVar7 != (QWidget *)0x0) && (QWidget::hide(pQVar7), direction == Backward)) {
    if (((this->opts).super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
         super_QFlagsStorage<QWizard::WizardOption>.i & 1) == 0) {
      (**(code **)(*(long *)this_00 + 0x1e0))(this_00);
      *(undefined1 *)(*(long *)&pQVar7->field_0x8 + 0x30e) = 0;
    }
    pDVar2 = (this->history).d.d;
    if ((pDVar2 == (Data *)0x0) ||
       (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QArrayDataPointer<int>::reallocateAndGrow
                (&(this->history).d,GrowsAtEnd,0,(QArrayDataPointer<int> *)0x0);
    }
    pqVar1 = &(this->history).d.size;
    *pqVar1 = *pqVar1 + -1;
  }
  this->current = newId;
  local_4c = *(int *)(*(long *)&this_00->field_0x8 + 0x340);
  local_48 = (QWizardPage *)0x0;
  pQVar7 = &QMap<int,_QWizardPage_*>::value
                      ((QMap<int,_QWizardPage_*> *)(*(long *)&this_00->field_0x8 + 0x2e0),&local_4c,
                       &local_48)->super_QWidget;
  if (pQVar7 != (QWidget *)0x0) {
    if (direction == Forward) {
      if (*(char *)(*(long *)&pQVar7->field_0x8 + 0x30e) == '\0') {
        *(undefined1 *)(*(long *)&pQVar7->field_0x8 + 0x30e) = 1;
        (**(code **)(*(long *)this_00 + 0x1d8))(this_00,this->current);
      }
      local_48 = (QWizardPage *)CONCAT44(local_48._4_4_,this->current);
      QtPrivate::QPodArrayOps<int>::emplace<int&>
                ((QPodArrayOps<int> *)&this->history,(this->history).d.size,(int *)&local_48);
      QList<int>::end(&this->history);
    }
    QWidget::show(pQVar7);
  }
  iVar4 = (**(code **)(*(long *)this_00 + 0x1d0))(this_00);
  this->canContinue = iVar4 != -1;
  if (pQVar7 == (QWidget *)0x0) {
    this->canFinish = false;
    _q_updateButtonStates(this);
    updateButtonTexts(this);
    uVar5 = 1;
  }
  else {
    bVar3 = QWizardPage::isFinalPage((QWizardPage *)pQVar7);
    this->canFinish = bVar3;
    _q_updateButtonStates(this);
    updateButtonTexts(this);
    uVar5 = *(byte *)(*(long *)&pQVar7->field_0x8 + 0x30d) + 1;
  }
  uVar8 = 3;
  if (this->canContinue != false) {
    uVar8 = (ulong)uVar5;
  }
  this_02 = *(QWidget **)((long)&this->field_20 + uVar8 * 8);
  if (((this->opts).super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
       super_QFlagsStorage<QWizard::WizardOption>.i & 8) == 0) {
    if (pQVar7 == (QWidget *)0x0) {
      this_01 = (QWidget *)0x0;
      goto LAB_005142db;
    }
  }
  else {
    uVar5 = this_02->data->widget_attributes & 1;
    this_01 = (QWidget *)0x0;
    if (uVar5 == 0) {
      this_01 = this_02;
    }
    if ((pQVar7 == (QWidget *)0x0) || (uVar5 == 0)) goto LAB_005142db;
  }
  iVar4 = 100;
  this_01 = pQVar7;
  do {
    this_01 = QWidget::nextInFocusChain(this_01);
    if (this_01 == (QWidget *)0x0) break;
    FVar6 = QWidget::focusPolicy(this_01);
    if (((this_01 != pQVar7) && ((FVar6 & TabFocus) != NoFocus)) &&
       (bVar3 = QWidget::isAncestorOf(pQVar7,this_01), bVar3)) goto LAB_005142db;
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  this_01 = (QWidget *)0x0;
LAB_005142db:
  if (this_01 != (QWidget *)0x0) {
    this_02 = this_01;
  }
  QWidget::setFocus(this_02,OtherFocusReason);
  if (this->wizStyle == MacStyle) {
    QWidget::updateGeometry(this_00);
  }
  enableUpdates(this);
  updateLayout(this);
  updatePalette(this);
  local_4c = this->current;
  local_48 = (QWizardPage *)0x0;
  piStack_40 = &local_4c;
  QMetaObject::activate(&this_00->super_QObject,&QWizard::staticMetaObject,0,&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWizardPrivate::switchToPage(int newId, Direction direction)
{
    Q_Q(QWizard);

    disableUpdates();

    int oldId = current;
    if (QWizardPage *oldPage = q->currentPage()) {
        oldPage->hide();

        if (direction == Backward) {
            if (!(opts & QWizard::IndependentPages)) {
                q->cleanupPage(oldId);
                oldPage->d_func()->initialized = false;
            }
            Q_ASSERT(history.constLast() == oldId);
            history.removeLast();
            Q_ASSERT(history.constLast() == newId);
        }
    }

    current = newId;

    QWizardPage *newPage = q->currentPage();
    if (newPage) {
        if (direction == Forward) {
            if (!newPage->d_func()->initialized) {
                newPage->d_func()->initialized = true;
                q->initializePage(current);
            }
            history.append(current);
        }
        newPage->show();
    }

    canContinue = (q->nextId() != -1);
    canFinish = (newPage && newPage->isFinalPage());

    _q_updateButtonStates();
    updateButtonTexts();

    const QWizard::WizardButton nextOrCommit =
        newPage && newPage->isCommitPage() ? QWizard::CommitButton : QWizard::NextButton;
    QAbstractButton *nextOrFinishButton =
        btns[canContinue ? nextOrCommit : QWizard::FinishButton];
    QWidget *candidate = nullptr;

    /*
        If there is no default button and the Next or Finish button
        is enabled, give focus directly to it as a convenience to the
        user. This is the normal case on OS X.

        Otherwise, give the focus to the new page's first child that
        can handle it. If there is no such child, give the focus to
        Next or Finish.
    */
    if ((opts & QWizard::NoDefaultButton) && nextOrFinishButton->isEnabled()) {
        candidate = nextOrFinishButton;
    } else if (newPage) {
        candidate = iWantTheFocus(newPage);
    }
    if (!candidate)
        candidate = nextOrFinishButton;
    candidate->setFocus();

    if (wizStyle == QWizard::MacStyle)
        q->updateGeometry();

    enableUpdates();
    updateLayout();
    updatePalette();

    emit q->currentIdChanged(current);
}